

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiguresTests.cpp
# Opt level: O0

void __thiscall agge::tests::RectangleTests::RectangleIteratorListsItsVertices(RectangleTests *this)

{
  point pVar1;
  allocator local_381;
  string local_380 [32];
  LocationInfo local_360;
  point local_338;
  point local_328;
  undefined8 local_318;
  real_t local_310;
  undefined8 local_308;
  real_t local_300;
  point local_2f8;
  undefined1 local_2e8 [8];
  point reference2 [6];
  real_t local_288;
  int iStack_284;
  real_t local_280;
  real_t local_278;
  int iStack_274;
  real_t local_270;
  real_t local_268;
  int iStack_264;
  real_t local_260;
  real_t local_258;
  int iStack_254;
  real_t local_250;
  point local_248;
  undefined1 local_238 [8];
  point points2 [6];
  undefined1 local_1e8 [8];
  rectangle r2;
  allocator local_1c1;
  string local_1c0 [32];
  LocationInfo local_1a0;
  point local_178;
  point local_168;
  undefined8 local_158;
  real_t local_150;
  undefined8 local_148;
  real_t local_140;
  point local_138;
  undefined1 local_128 [8];
  point reference1 [6];
  real_t local_c8;
  int iStack_c4;
  real_t local_c0;
  real_t local_b8;
  int iStack_b4;
  real_t local_b0;
  real_t local_a8;
  int iStack_a4;
  real_t local_a0;
  real_t local_98;
  int iStack_94;
  real_t local_90;
  point local_88;
  undefined1 local_78 [8];
  point points1 [6];
  undefined1 local_24 [8];
  rectangle r1;
  RectangleTests *this_local;
  
  r1._12_8_ = this;
  rectangle::rectangle((rectangle *)local_24,10.1,20.2,30.0,4.7);
  pVar1 = vertex<agge::rectangle>((rectangle *)local_24);
  local_88.command = pVar1.command;
  points1[0].x = (real_t)local_88.command;
  local_88._0_8_ = pVar1._0_8_;
  local_78._0_4_ = local_88.x;
  local_78._4_4_ = local_88.y;
  pVar1 = vertex<agge::rectangle>((rectangle *)local_24);
  local_90 = (real_t)pVar1.command;
  points1[1].x = local_90;
  _local_98 = pVar1._0_8_;
  points1[0].y = local_98;
  points1[0].command = iStack_94;
  pVar1 = vertex<agge::rectangle>((rectangle *)local_24);
  local_a0 = (real_t)pVar1.command;
  points1[2].x = local_a0;
  _local_a8 = pVar1._0_8_;
  points1[1].y = local_a8;
  points1[1].command = iStack_a4;
  pVar1 = vertex<agge::rectangle>((rectangle *)local_24);
  local_b0 = (real_t)pVar1.command;
  points1[3].x = local_b0;
  _local_b8 = pVar1._0_8_;
  points1[2].y = local_b8;
  points1[2].command = iStack_b4;
  pVar1 = vertex<agge::rectangle>((rectangle *)local_24);
  local_c0 = (real_t)pVar1.command;
  points1[4].x = local_c0;
  _local_c8 = pVar1._0_8_;
  points1[3].y = local_c8;
  points1[3].command = iStack_c4;
  pVar1 = vertex<agge::rectangle>((rectangle *)local_24);
  points1[5].x = (real_t)pVar1.command;
  points1[4]._4_8_ = pVar1._0_8_;
  pVar1 = moveto(10.1,20.2);
  local_138.command = pVar1.command;
  local_138._0_8_ = pVar1._0_8_;
  local_128 = (undefined1  [8])local_138._0_8_;
  reference1[0].x = (real_t)local_138.command;
  pVar1 = lineto(30.0,20.2);
  local_140 = (real_t)pVar1.command;
  local_148 = pVar1._0_8_;
  reference1[0]._4_8_ = local_148;
  reference1[1].x = local_140;
  pVar1 = lineto(30.0,4.7);
  local_150 = (real_t)pVar1.command;
  local_158 = pVar1._0_8_;
  reference1[1]._4_8_ = local_158;
  reference1[2].x = local_150;
  pVar1 = lineto(10.1,4.7);
  local_168.command = pVar1.command;
  reference1[3].x = (real_t)local_168.command;
  local_168._0_8_ = pVar1._0_8_;
  reference1[2].y = local_168.x;
  reference1[2].command = (int)local_168.y;
  reference1[3].y = 0.0;
  reference1[3].command = 0;
  reference1[4].x = 6.72623e-44;
  local_168 = pVar1;
  pVar1 = stop();
  local_178.command = pVar1.command;
  reference1[5].x = (real_t)local_178.command;
  local_178._0_8_ = pVar1._0_8_;
  reference1[4].y = local_178.x;
  reference1[4].command = (int)local_178.y;
  local_178 = pVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_1c1);
  ut::LocationInfo::LocationInfo(&local_1a0,(string *)local_1c0,0x76);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,6ul>
            ((point (*) [6])local_128,(point (*) [6])local_78,&local_1a0);
  ut::LocationInfo::~LocationInfo(&local_1a0);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  rectangle::rectangle((rectangle *)local_1e8,11.1,12.2,13.3,1.7);
  pVar1 = vertex<agge::rectangle>((rectangle *)local_1e8);
  local_248.command = pVar1.command;
  points2[0].x = (real_t)local_248.command;
  local_248._0_8_ = pVar1._0_8_;
  local_238._0_4_ = local_248.x;
  local_238._4_4_ = local_248.y;
  pVar1 = vertex<agge::rectangle>((rectangle *)local_1e8);
  local_250 = (real_t)pVar1.command;
  points2[1].x = local_250;
  _local_258 = pVar1._0_8_;
  points2[0].y = local_258;
  points2[0].command = iStack_254;
  pVar1 = vertex<agge::rectangle>((rectangle *)local_1e8);
  local_260 = (real_t)pVar1.command;
  points2[2].x = local_260;
  _local_268 = pVar1._0_8_;
  points2[1].y = local_268;
  points2[1].command = iStack_264;
  pVar1 = vertex<agge::rectangle>((rectangle *)local_1e8);
  local_270 = (real_t)pVar1.command;
  points2[3].x = local_270;
  _local_278 = pVar1._0_8_;
  points2[2].y = local_278;
  points2[2].command = iStack_274;
  pVar1 = vertex<agge::rectangle>((rectangle *)local_1e8);
  local_280 = (real_t)pVar1.command;
  points2[4].x = local_280;
  _local_288 = pVar1._0_8_;
  points2[3].y = local_288;
  points2[3].command = iStack_284;
  pVar1 = vertex<agge::rectangle>((rectangle *)local_1e8);
  points2[5].x = (real_t)pVar1.command;
  points2[4]._4_8_ = pVar1._0_8_;
  pVar1 = moveto(11.1,12.2);
  local_2f8.command = pVar1.command;
  local_2f8._0_8_ = pVar1._0_8_;
  local_2e8 = (undefined1  [8])local_2f8._0_8_;
  reference2[0].x = (real_t)local_2f8.command;
  pVar1 = lineto(13.3,12.2);
  local_300 = (real_t)pVar1.command;
  local_308 = pVar1._0_8_;
  reference2[0]._4_8_ = local_308;
  reference2[1].x = local_300;
  pVar1 = lineto(13.3,1.7);
  local_310 = (real_t)pVar1.command;
  local_318 = pVar1._0_8_;
  reference2[1]._4_8_ = local_318;
  reference2[2].x = local_310;
  pVar1 = lineto(11.1,1.7);
  local_328.command = pVar1.command;
  reference2[3].x = (real_t)local_328.command;
  local_328._0_8_ = pVar1._0_8_;
  reference2[2].y = local_328.x;
  reference2[2].command = (int)local_328.y;
  reference2[3].y = 0.0;
  reference2[3].command = 0;
  reference2[4].x = 6.72623e-44;
  local_328 = pVar1;
  pVar1 = stop();
  local_338.command = pVar1.command;
  reference2[5].x = (real_t)local_338.command;
  local_338._0_8_ = pVar1._0_8_;
  reference2[4].y = local_338.x;
  reference2[4].command = (int)local_338.y;
  local_338 = pVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_380,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_381);
  ut::LocationInfo::LocationInfo(&local_360,(string *)local_380,0x84);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,6ul>
            ((point (*) [6])local_2e8,(point (*) [6])local_238,&local_360);
  ut::LocationInfo::~LocationInfo(&local_360);
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  return;
}

Assistant:

test( RectangleIteratorListsItsVertices )
			{
				// INIT
				rectangle r1(10.1f, 20.2f, 30.0f, 4.7f);

				// ACT
				mocks::path::point points1[] = { vertex(r1), vertex(r1), vertex(r1), vertex(r1), vertex(r1), vertex(r1), };

				// ASSERT
				mocks::path::point reference1[] = {
					moveto(10.1f, 20.2f), lineto(30.0f, 20.2f), lineto(30.0f, 4.7f), lineto(10.1f, 4.7f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close }, stop(),
				};

				assert_equal(reference1, points1);

				// INIT
				rectangle r2(11.1f, 12.2f, 13.3f, 1.7f);

				// ACT
				mocks::path::point points2[] = { vertex(r2), vertex(r2), vertex(r2), vertex(r2), vertex(r2), vertex(r2), };

				// ASSERT
				mocks::path::point reference2[] = {
					moveto(11.1f, 12.2f), lineto(13.3f, 12.2f), lineto(13.3f, 1.7f), lineto(11.1f, 1.7f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close }, stop(),
				};

				assert_equal(reference2, points2);
			}